

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_extract_tokens(NGP_RAW_LINE *cl)

{
  int iVar1;
  char *pcVar2;
  undefined8 *in_RDI;
  char *eqsi;
  int i;
  int cl_flags;
  char *s;
  char *p;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int iVar3;
  uint uVar4;
  char *local_20;
  char *local_18;
  
  local_18 = (char *)*in_RDI;
  if (local_18 == (char *)0x0) {
    return 0x16a;
  }
  in_RDI[4] = 0;
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  uVar4 = 0;
  iVar3 = 0;
  while( true ) {
    if ((*local_18 == '\0') || (*local_18 == '\n')) {
      *(undefined1 *)*in_RDI = 0;
      in_RDI[1] = *in_RDI;
      in_RDI[4] = *in_RDI;
      *(undefined4 *)(in_RDI + 3) = 7;
      return 0;
    }
    if ((*local_18 != ' ') && (*local_18 != '\t')) break;
    if (6 < iVar3) {
      in_RDI[4] = local_18 + 1;
      local_20 = (char *)in_RDI[4];
      while( true ) {
        if (*local_20 == '\n') {
          *local_20 = '\0';
        }
        if (*local_20 == '\0') break;
        local_20 = local_20 + 1;
      }
      *(undefined1 *)*in_RDI = 0;
      in_RDI[1] = *in_RDI;
      *(undefined4 *)(in_RDI + 3) = 7;
      return 0;
    }
    local_18 = local_18 + 1;
    iVar3 = iVar3 + 1;
  }
  in_RDI[1] = local_18;
  for (; (*local_18 != '\0' && (*local_18 != '\n')); local_18 = local_18 + 1) {
    iVar1 = fits_strncasecmp((char *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffc8);
    if ((iVar1 == 0) &&
       (in_stack_ffffffffffffffd0 = strchr(local_18,0x3d), in_stack_ffffffffffffffd0 != (char *)0x0)
       ) {
      uVar4 = uVar4 | 1;
      local_18 = in_stack_ffffffffffffffd0;
      goto LAB_001ddc97;
    }
    if ((*local_18 == ' ') || (*local_18 == '\t')) goto LAB_001ddc97;
    if (*local_18 == '=') {
      uVar4 = uVar4 | 1;
      goto LAB_001ddc97;
    }
  }
  *local_18 = '\0';
LAB_001ddc97:
  if (*local_18 != '\0') {
    *local_18 = '\0';
    local_18 = local_18 + 1;
  }
  iVar1 = fits_strcasecmp((char *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffd0);
  if (((iVar1 == 0) ||
      (iVar1 = fits_strcasecmp((char *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffd0), iVar1 == 0)
      ) || (iVar1 = fits_strcasecmp((char *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffd0),
           iVar1 == 0)) {
    in_RDI[4] = local_18;
    local_20 = (char *)in_RDI[4];
    while( true ) {
      if (*local_20 == '\n') {
        *local_20 = '\0';
      }
      if (*local_20 == '\0') break;
      local_20 = local_20 + 1;
    }
    *(undefined4 *)(in_RDI + 3) = 7;
  }
  else {
    iVar3 = fits_strcasecmp((char *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffd0);
    if (iVar3 == 0) {
      for (; (*local_18 == ' ' || (*local_18 == '\t')); local_18 = local_18 + 1) {
      }
      in_RDI[2] = local_18;
      local_20 = (char *)in_RDI[2];
      while( true ) {
        if (*local_20 == '\n') {
          *local_20 = '\0';
        }
        if (*local_20 == '\0') break;
        local_20 = local_20 + 1;
      }
      *(undefined4 *)(in_RDI + 3) = 0;
    }
    else {
      for (; (*local_18 != '\0' && (*local_18 != '\n')); local_18 = local_18 + 1) {
        if ((*local_18 != ' ') && (*local_18 != '\t')) {
          if (((uVar4 & 1) != 0) || (*local_18 != '=')) {
            if (*local_18 == '/') {
              pcVar2 = local_18 + 1;
              if ((*pcVar2 == ' ') || (*pcVar2 == '\t')) {
                pcVar2 = local_18 + 2;
              }
              local_18 = pcVar2;
              in_RDI[4] = local_18;
              local_20 = (char *)in_RDI[4];
              while( true ) {
                if (*local_20 == '\n') {
                  *local_20 = '\0';
                }
                if (*local_20 == '\0') break;
                local_20 = local_20 + 1;
              }
              return 0;
            }
            if (*local_18 != '\'') {
              in_RDI[2] = local_18;
              *(undefined4 *)(in_RDI + 3) = 0;
              while( true ) {
                if ((*local_18 == '\0') || (*local_18 == '\n')) {
                  *local_18 = '\0';
                  return 0;
                }
                if ((*local_18 == ' ') || (*local_18 == '\t')) break;
                local_18 = local_18 + 1;
              }
              if (*local_18 != '\0') {
                *local_18 = '\0';
                local_18 = local_18 + 1;
              }
              goto LAB_001de171;
            }
            local_20 = local_18 + 1;
            in_RDI[2] = local_20;
            *(undefined4 *)(in_RDI + 3) = 2;
            local_18 = local_20;
            do {
              if ((*local_18 == '\0') || (*local_18 == '\n')) {
                *local_20 = '\0';
                return 0;
              }
              if (*local_18 == '\'') {
                if ((local_18[1] == '\0') || (local_18[1] == '\n')) {
                  *local_20 = '\0';
                  return 0;
                }
                if ((local_18[1] == '\t') || (local_18[1] == ' ')) {
                  *local_20 = '\0';
                  local_18 = local_18 + 1;
LAB_001de171:
                  while( true ) {
                    if ((*local_18 == '\0') || (*local_18 == '\n')) {
                      return 0;
                    }
                    if ((*local_18 != ' ') && (*local_18 != '\t')) break;
                    local_18 = local_18 + 1;
                  }
                  if (*local_18 != '/') {
                    *(undefined4 *)(in_RDI + 5) = 1;
                    return 0;
                  }
                  pcVar2 = local_18 + 1;
                  if ((*pcVar2 == ' ') || (*pcVar2 == '\t')) {
                    pcVar2 = local_18 + 2;
                  }
                  local_18 = pcVar2;
                  in_RDI[4] = local_18;
                  local_20 = (char *)in_RDI[4];
                  while( true ) {
                    if (*local_20 == '\n') {
                      *local_20 = '\0';
                    }
                    if (*local_20 == '\0') break;
                    local_20 = local_20 + 1;
                  }
                  return 0;
                }
                if (local_18[1] == '\'') {
                  local_18 = local_18 + 1;
                }
              }
              *local_20 = *local_18;
              local_20 = local_20 + 1;
              local_18 = local_18 + 1;
            } while( true );
          }
          uVar4 = uVar4 | 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int	ngp_extract_tokens(NGP_RAW_LINE *cl)
 { char *p, *s;
   int	cl_flags, i;

   p = cl->line;				/* start from beginning of line */
   if (NULL == p) return(NGP_NUL_PTR);

   cl->name = cl->value = cl->comment = NULL;
   cl->type = NGP_TTYPE_UNKNOWN;
   cl->format = NGP_FORMAT_OK;

   cl_flags = 0;

   for (i=0;; i++)				/* if 8 spaces at beginning then line is comment */
    { if ((0 == *p) || ('\n' == *p))
        {					/* if line has only blanks -> write blank keyword */
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->comment = cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;		/* signal write unformatted to FITS file */
          return(NGP_OK);
        }
      if ((' ' != *p) && ('\t' != *p)) break;
      if (i >= 7)
        { 
          cl->comment = p + 1;
          for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
           { if ('\n' == *s) *s = 0;
	     if (0 == *s) break;
           }
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;
          return(NGP_OK);
        }
      p++;
    }

   cl->name = p;

   for (;;)					/* we need to find 1st whitespace */
    { if ((0 == *p) || ('\n' == *p))
        { *p = 0;
          break;
        }

      /*
        from Richard Mathar, 2002-05-03, add 10 lines:
        if upper/lowercase HIERARCH followed also by an equal sign...
      */
      if( fits_strncasecmp("HIERARCH",p,strlen("HIERARCH")) == 0 )
      {
           char * const eqsi=strchr(p,'=') ;
           if( eqsi )
           {
              cl_flags |= NGP_FOUND_EQUAL_SIGN ;
              p=eqsi ;
              break ;
           }
      }

      if ((' ' == *p) || ('\t' == *p)) break;
      if ('=' == *p)
        { cl_flags |= NGP_FOUND_EQUAL_SIGN;
          break;
        }

      p++;
    }

   if (*p) *(p++) = 0;				/* found end of keyname so terminate string with zero */

   if ((!fits_strcasecmp("HISTORY", cl->name))
    || (!fits_strcasecmp("COMMENT", cl->name))
    || (!fits_strcasecmp("CONTINUE", cl->name)))
     { cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_RAW;
       return(NGP_OK);
     }

   if (!fits_strcasecmp("\\INCLUDE", cl->name))
     {
       for (;; p++)  if ((' ' != *p) && ('\t' != *p)) break; /* skip whitespace */

       cl->value = p;
       for (s = cl->value;; s++)		/* filter out any EOS characters */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_UNKNOWN;
       return(NGP_OK);
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' == *p) || ('\t' == *p)) continue; /* skip whitespace */
      if (cl_flags & NGP_FOUND_EQUAL_SIGN) break;
      if ('=' != *p) break;			/* ignore initial equal sign */
      cl_flags |= NGP_FOUND_EQUAL_SIGN;
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   if ('\'' == *p)				/* we have found string within quotes */
     { cl->value = s = ++p;			/* set pointer to beginning of that string */
       cl->type = NGP_TTYPE_STRING;		/* signal that it is of string type */

       for (;;)					/* analyze it */
        { if ((0 == *p) || ('\n' == *p))	/* end of line -> end of string */
            { *s = 0; return(NGP_OK); }

          if ('\'' == *p)			/* we have found doublequote */
            { if ((0 == p[1]) || ('\n' == p[1]))/* doublequote is the last character in line */
                { *s = 0; return(NGP_OK); }
              if (('\t' == p[1]) || (' ' == p[1])) /* duoblequote was string terminator */
                { *s = 0; p++; break; }
              if ('\'' == p[1]) p++;		/* doublequote is inside string, convert "" -> " */ 
            }

          *(s++) = *(p++);			/* compact string in place, necess. by "" -> " conversion */
        }
     }
   else						/* regular token */
     { 
       cl->value = p;				/* set pointer to token */
       cl->type = NGP_TTYPE_UNKNOWN;		/* we dont know type at the moment */
       for (;; p++)				/* we need to find 1st whitespace */
        { if ((0 == *p) || ('\n' == *p))
            { *p = 0; return(NGP_OK); }
          if ((' ' == *p) || ('\t' == *p)) break;
        }
       if (*p)  *(p++) = 0;			/* found so terminate string with zero */
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' != *p) && ('\t' != *p)) break;	/* skip whitespace */
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   cl->format = NGP_FORMAT_ERROR;
   return(NGP_OK);				/* too many tokens ... */
 }